

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  pointer *out;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  reference ppcVar6;
  string *file2;
  reference ppcVar7;
  cmsysProcess *cp_00;
  char **command;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  rep_conflict timeout_00;
  bool local_1991;
  bool local_189c;
  byte local_189a;
  bool local_1841;
  bool local_1831;
  byte local_1819;
  string local_1818 [32];
  undefined1 local_17f8 [8];
  ostringstream cmCTestLog_msg_7;
  allocator<char> local_1679;
  string local_1678 [8];
  string outerr_1;
  undefined1 local_1638 [8];
  ostringstream cmCTestLog_msg_6;
  allocator<char> local_14b9;
  string local_14b8 [8];
  string outerr;
  string local_1490 [4];
  int result;
  undefined1 local_1470 [8];
  ostringstream cmCTestLog_msg_5;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_12f8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_12f0;
  vector<char,_std::allocator<char>_> local_12e8;
  string local_12d0 [32];
  cmCTestLogWrite local_12b0;
  undefined1 local_12a0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_1128;
  string local_1108 [32];
  cmCTestLogWrite local_10e8;
  undefined1 local_10d8 [8];
  ostringstream cmCTestLog_msg_3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f58;
  const_iterator local_f50;
  undefined1 local_f48 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_f20;
  int length;
  char *data;
  undefined1 local_ef8 [8];
  ostringstream cmCTestLog_msg_2;
  cmsysProcess *cp;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_d70;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  vector<char,_std::allocator<char>_> tempOutput;
  undefined1 local_d30 [8];
  ostringstream cmCTestLog_msg_1;
  string local_bb8 [32];
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_b98;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_b90;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv_1;
  ostringstream local_b68 [8];
  ostringstream msg;
  duration<double,_std::ratio<1L,_1L>_> local_9f0;
  duration<double,_std::ratio<1L,_1L>_> local_9e8;
  char *local_9e0;
  char *i;
  iterator __end2;
  iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream oss;
  undefined1 local_830 [8];
  cmCTest inst;
  string local_2a8;
  string local_288 [38];
  byte local_262;
  allocator<char> local_261;
  duration<double,_std::ratio<1L,_1L>_> local_260;
  string local_258;
  ostringstream local_228 [8];
  ostringstream cmCTestLog_msg;
  int local_ac;
  duration<long,_std::ratio<1L,_1L>_> local_a8;
  cmCTest *local_a0;
  duration<double,_std::ratio<1L,_1L>_> local_98;
  duration<double,_std::ratio<1L,_1L>_> local_90;
  duration<double,_std::ratio<1L,_1L>_> local_88;
  duration<double,_std::ratio<1L,_1L>_> local_80;
  int local_74;
  duration<long,_std::ratio<60L,_1L>_> local_70;
  duration<double,_std::ratio<1L,_1L>_> local_68;
  duration<double,_std::ratio<1L,_1L>_> local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58;
  cmDuration timeout;
  bool modifyEnv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *environment_local;
  ostream *log_local;
  int *retVal_local;
  string *output_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *argv_local;
  cmCTest *this_local;
  cmDuration testTimeOut_local;
  
  local_1819 = 0;
  this_local = (cmCTest *)testTimeOut.__r;
  if (environment !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(environment);
    local_1819 = bVar1 ^ 0xff;
  }
  timeout.__r._7_1_ = local_1819 & 1;
  local_58.__r = (rep_conflict)GetRemainingTimeAllowed(this);
  local_60.__r = (rep_conflict)MaxDuration();
  bVar1 = std::chrono::operator!=(&local_58,&local_60);
  if (bVar1) {
    local_74 = 2;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_70,&local_74);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_68,&local_70);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator-=(&local_58,&local_68);
  }
  local_80 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator>(&this->TimeOut,&local_80);
  local_1831 = false;
  if (bVar1) {
    local_1831 = std::chrono::operator<(&this->TimeOut,&local_58);
  }
  if (local_1831 != false) {
    local_58.__r = (this->TimeOut).__r;
  }
  local_88 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator>((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_88);
  local_1841 = false;
  if (bVar1) {
    local_90.__r = (rep_conflict)GetRemainingTimeAllowed(this);
    local_1841 = std::chrono::operator<
                           ((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_90);
  }
  if (local_1841 != false) {
    local_58.__r = (rep_conflict)this_local;
  }
  local_98 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator<=(&local_58,&local_98);
  if (bVar1) {
    local_ac = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_a8,&local_ac);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_a0,&local_a8);
    local_58.__r = (rep_conflict)local_a0;
  }
  std::__cxx11::ostringstream::ostringstream(local_228);
  poVar4 = std::operator<<((ostream *)local_228,"Test timeout computed to be: ");
  local_262 = 0;
  local_260.__r = (rep_conflict)MaxDuration();
  bVar1 = std::chrono::operator==(&local_58,&local_260);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_262 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"infinite",&local_261);
  }
  else {
    uVar2 = cmDurationTo<unsigned_int>(&local_58);
    std::__cxx11::to_string(&local_258,uVar2);
  }
  poVar4 = std::operator<<(poVar4,(string *)&local_258);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_258);
  if ((local_262 & 1) != 0) {
    std::allocator<char>::~allocator(&local_261);
  }
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x487,pcVar5,false);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::ostringstream::~ostringstream(local_228);
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](argv,0);
  pcVar5 = *ppcVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,pcVar5,
             (allocator<char> *)
             ((long)&inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  file2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar1 = cmsys::SystemTools::SameFile(&local_2a8,file2);
  local_189a = 0;
  if (bVar1) {
    local_189a = this->ForceNewCTestProcess ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  if ((local_189a & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
    if (output != (string *)0x0) {
      std::__cxx11::string::clear();
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
    ::unique_ptr<std::default_delete<cmSystemTools::SaveRestoreEnvironment>,void>
              ((unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
                *)&local_d70);
    if ((timeout.__r._7_1_ & 1) != 0) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::operator=(&local_d70,
                  (unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&cp);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&cp);
      cmSystemTools::AppendEnv(environment);
    }
    cp_00 = cmsysProcess_New();
    command = std::vector<const_char_*,_std::allocator<const_char_*>_>::data(argv);
    cmsysProcess_SetCommand(cp_00,command);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ef8);
    poVar4 = std::operator<<((ostream *)local_ef8,"Command is: ");
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](argv,0);
    poVar4 = std::operator<<(poVar4,*ppcVar6);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x4ca,pcVar5,false);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ef8);
    bVar1 = cmSystemTools::GetRunCommandHideConsole();
    if (bVar1) {
      cmsysProcess_SetOption(cp_00,0,1);
    }
    timeout_00 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_58);
    cmsysProcess_SetTimeout(cp_00,timeout_00);
    cmsysProcess_Execute(cp_00);
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
    std::__cxx11::string::string((string *)local_f48);
    while (iVar3 = cmsysProcess_WaitForData
                             (cp_00,&stack0xfffffffffffff0e0,
                              (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0), iVar3 != 0
          ) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_f20,
                 (long)(int)strdata.field_2._12_4_,(string *)local_f48,0);
      if (output != (string *)0x0) {
        local_f58._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)&saveEnv);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_f50,&local_f58);
        std::vector<char,std::allocator<char>>::insert<char*,void>
                  ((vector<char,std::allocator<char>> *)&saveEnv,local_f50,pcStack_f20,
                   pcStack_f20 + (int)strdata.field_2._12_4_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10d8);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      sVar8 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_10e8,pcVar5,sVar8);
      ::operator<<((ostream *)local_10d8,&local_10e8);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0x4dc,pcVar5,false);
      std::__cxx11::string::~string(local_1108);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10d8);
      if (log != (ostream *)0x0) {
        lVar9 = std::__cxx11::string::c_str();
        std::__cxx11::string::size();
        std::ostream::write((char *)log,lVar9);
      }
    }
    std::__cxx11::string::string((string *)&local_1128);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_1128,
               (string *)local_f48,0);
    std::__cxx11::string::~string((string *)&local_1128);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12a0);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      sVar8 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_12b0,pcVar5,sVar8);
      ::operator<<((ostream *)local_12a0,&local_12b0);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0x4e4,pcVar5,false);
      std::__cxx11::string::~string(local_12d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12a0);
      if (log != (ostream *)0x0) {
        lVar9 = std::__cxx11::string::c_str();
        std::__cxx11::string::size();
        std::ostream::write((char *)log,lVar9);
      }
    }
    cmsysProcess_WaitForExit(cp_00,(double *)0x0);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_12e8,(vector<char,_std::allocator<char>_> *)&saveEnv);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_12e8,
               (vector<char,_std::allocator<char>_> *)&saveEnv,0);
    std::vector<char,_std::allocator<char>_>::~vector(&local_12e8);
    local_1991 = false;
    if (output != (string *)0x0) {
      local_12f0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_12f8._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_1991 = __gnu_cxx::operator!=(&local_12f0,&local_12f8);
    }
    if (local_1991 != false) {
      pcVar5 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)&saveEnv);
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)&saveEnv);
      std::__cxx11::string::append((char *)output,(ulong)pcVar5);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1470);
    poVar4 = std::operator<<((ostream *)local_1470,"-- Process completed");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x4f0,pcVar5,false);
    std::__cxx11::string::~string(local_1490);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1470);
    outerr.field_2._12_4_ = cmsysProcess_GetState(cp_00);
    if (outerr.field_2._12_4_ == 4) {
      iVar3 = cmsysProcess_GetExitValue(cp_00);
      *retVal = iVar3;
      if ((*retVal != 0) && ((this->OutputTestOutputOnTestFailure & 1U) != 0)) {
        OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
      }
    }
    else if (outerr.field_2._12_4_ == 2) {
      if ((this->OutputTestOutputOnTestFailure & 1U) != 0) {
        OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
      }
      iVar3 = cmsysProcess_GetExitException(cp_00);
      *retVal = iVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_14b8,"\n*** Exception executing: ",&local_14b9);
      std::allocator<char>::~allocator(&local_14b9);
      pcVar5 = cmsysProcess_GetExceptionString(cp_00);
      std::__cxx11::string::operator+=(local_14b8,pcVar5);
      if (output != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)output,local_14b8);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1638);
      poVar4 = std::operator<<((ostream *)local_1638,local_14b8);
      pvVar11 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar11,std::flush<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0x505,pcVar5,false);
      std::__cxx11::string::~string((string *)(outerr_1.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1638);
      std::__cxx11::string::~string(local_14b8);
    }
    else if (outerr.field_2._12_4_ == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1678,"\n*** ERROR executing: ",&local_1679);
      std::allocator<char>::~allocator(&local_1679);
      pcVar5 = cmsysProcess_GetErrorString(cp_00);
      std::__cxx11::string::operator+=(local_1678,pcVar5);
      if (output != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)output,local_1678);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_17f8);
      poVar4 = std::operator<<((ostream *)local_17f8,local_1678);
      pvVar11 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar11,std::flush<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0x50e,pcVar5,false);
      std::__cxx11::string::~string(local_1818);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_17f8);
      std::__cxx11::string::~string(local_1678);
    }
    cmsysProcess_Delete(cp_00);
    testTimeOut_local.__r._4_4_ = outerr.field_2._12_4_;
    std::__cxx11::string::~string((string *)local_f48);
    cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr(&local_d70);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
  }
  else {
    cmCTest((cmCTest *)local_830);
    std::__cxx11::string::operator=((string *)&inst,(string *)&this->ConfigType);
    inst.SpecificTrack.field_2._8_8_ = local_58.__r;
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    out = &args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    SetStreams((cmCTest *)local_830,(ostream *)out,(ostream *)out);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    __end2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(argv);
    i = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(argv);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&i), bVar1) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end2);
      local_9e0 = *ppcVar7;
      if (local_9e0 != (char *)0x0) {
        iVar3 = strcmp(local_9e0,"--build-generator");
        local_189c = false;
        if (iVar3 == 0) {
          local_9e8.__r = (rep_conflict)MaxDuration();
          bVar1 = std::chrono::operator!=(&local_58,&local_9e8);
          local_189c = false;
          if (bVar1) {
            local_9f0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
            local_189c = std::chrono::operator>(&local_58,&local_9f0);
          }
        }
        if (local_189c != false) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[15]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                     (char (*) [15])"--test-timeout");
          std::__cxx11::ostringstream::ostringstream(local_b68);
          uVar2 = cmDurationTo<unsigned_int>(&local_58);
          std::ostream::operator<<(local_b68,uVar2);
          std::__cxx11::ostringstream::str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(value_type *)&saveEnv_1);
          std::__cxx11::string::~string((string *)&saveEnv_1);
          std::__cxx11::ostringstream::~ostringstream(local_b68);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                   &local_9e0);
      }
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end2);
    }
    if (log != (ostream *)0x0) {
      poVar4 = std::operator<<(log,"* Run internal CTest");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
    ::unique_ptr<std::default_delete<cmSystemTools::SaveRestoreEnvironment>,void>
              ((unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
                *)&local_b90);
    if ((timeout.__r._7_1_ & 1) != 0) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::operator=(&local_b90,&local_b98);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr(&local_b98);
      cmSystemTools::AppendEnv(environment);
    }
    iVar3 = Run((cmCTest *)local_830,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2,output);
    *retVal = iVar3;
    if (output != (string *)0x0) {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)output,local_bb8);
      std::__cxx11::string::~string(local_bb8);
    }
    if ((log != (ostream *)0x0) && (output != (string *)0x0)) {
      std::operator<<(log,(string *)output);
    }
    if (output != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d30);
      poVar4 = std::operator<<((ostream *)local_d30,"Internal cmCTest object used to run test.");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,(string *)output);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0x4b8,pcVar5,false);
      std::__cxx11::string::~string
                ((string *)
                 &tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d30);
    }
    testTimeOut_local.__r._4_4_ = 4;
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr(&local_b90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ~cmCTest((cmCTest *)local_830);
  }
  return testTimeOut_local.__r._4_4_;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, cmDuration testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->TimeOut > cmDuration::zero() && this->TimeOut < timeout) {
    timeout = this->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->ForceNewCTestProcess) {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (char const* i : argv) {
      if (i) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(i, "--build-generator") == 0 &&
            timeout != cmCTest::MaxDuration() &&
            timeout > cmDuration::zero()) {
          args.emplace_back("--test-timeout");
          std::ostringstream msg;
          msg << cmDurationTo<unsigned int>(timeout);
          args.push_back(msg.str());
        }
        args.emplace_back(i);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      tempOutput.insert(tempOutput.end(), data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}